

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::TransformationParameter::InternalSwap
          (TransformationParameter *this,TransformationParameter *other)

{
  InternalMetadataWithArena *this_00;
  TransformationParameter *other_local;
  TransformationParameter *this_local;
  Container *local_30;
  
  google::protobuf::RepeatedField<float>::InternalSwap(&this->mean_value_,&other->mean_value_);
  std::swap<std::__cxx11::string*>(&(this->mean_file_).ptr_,&(other->mean_file_).ptr_);
  std::swap<unsigned_int>(&this->crop_size_,&other->crop_size_);
  std::swap<bool>(&this->mirror_,&other->mirror_);
  std::swap<bool>(&this->force_color_,&other->force_color_);
  std::swap<bool>(&this->force_gray_,&other->force_gray_);
  std::swap<float>(&this->scale_,&other->scale_);
  std::swap<unsigned_int>((this->_has_bits_).has_bits_,(other->_has_bits_).has_bits_);
  this_00 = &other->_internal_metadata_;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) != 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) != 1) goto LAB_00780ab9;
  }
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
               ::
               PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                         ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                           *)this_00);
  }
  else {
    local_30 = (Container *)
               google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  google::protobuf::internal::InternalMetadataWithArena::DoSwap
            (&this->_internal_metadata_,&local_30->unknown_fields);
LAB_00780ab9:
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void TransformationParameter::InternalSwap(TransformationParameter* other) {
  mean_value_.InternalSwap(&other->mean_value_);
  mean_file_.Swap(&other->mean_file_);
  std::swap(crop_size_, other->crop_size_);
  std::swap(mirror_, other->mirror_);
  std::swap(force_color_, other->force_color_);
  std::swap(force_gray_, other->force_gray_);
  std::swap(scale_, other->scale_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}